

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QExpression.hpp
# Opt level: O3

bool __thiscall Qentem::QExpression::operator>=(QExpression *this,QExpression *right)

{
  ExpressionType EVar1;
  undefined1 auVar2 [16];
  QExpression *pQVar3;
  bool bVar4;
  double dVar5;
  undefined1 in_ZMM0 [64];
  
  EVar1 = this->Type;
  if (EVar1 == RealNumber) {
    if (right->Type != RealNumber) {
      bVar4 = *(double *)&this->field_0 < (double)(long)(right->field_0).SubExpressions.storage_;
      goto LAB_00128767;
    }
LAB_0012875f:
    dVar5 = *(double *)&this->field_0;
  }
  else if (EVar1 == IntegerNumber) {
    pQVar3 = (this->field_0).SubExpressions.storage_;
    if (right->Type != RealNumber) {
LAB_00128752:
      return (long)(right->field_0).SubExpressions.storage_ <= (long)pQVar3;
    }
    dVar5 = (double)(long)pQVar3;
  }
  else {
    if (EVar1 != NaturalNumber) goto LAB_0012875f;
    pQVar3 = (this->field_0).SubExpressions.storage_;
    if (right->Type != RealNumber) goto LAB_00128752;
    auVar2 = vcvtusi2sd_avx512f(in_ZMM0._0_16_,pQVar3);
    dVar5 = auVar2._0_8_;
  }
  bVar4 = dVar5 < *(double *)&right->field_0;
LAB_00128767:
  return !bVar4;
}

Assistant:

bool operator>=(const QExpression &right) const noexcept {
        switch (Type) {
            case ExpressionType::NaturalNumber: {
                if (right.Type == ExpressionType::RealNumber) {
                    return (double(Value.Number.Natural) >= right.Value.Number.Real);
                }

                return (Value.Number.Integer >= right.Value.Number.Integer);
            }

            case ExpressionType::IntegerNumber: {
                if (right.Type == ExpressionType::RealNumber) {
                    return (double(Value.Number.Integer) >= right.Value.Number.Real);
                }

                return (Value.Number.Integer >= right.Value.Number.Integer);
            }

            case ExpressionType::RealNumber: {
                if (right.Type != ExpressionType::RealNumber) {
                    return (Value.Number.Real >= double(right.Value.Number.Integer));
                }
            }

            default: {
            }
        }

        return (Value.Number.Real >= right.Value.Number.Real);
    }